

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.cpp
# Opt level: O3

void __thiscall cdnsBlockTables::clear(cdnsBlockTables *this)

{
  pointer pcVar1;
  pointer pcVar2;
  pointer pcVar3;
  pointer pcVar4;
  pointer pcVar5;
  pointer pcVar6;
  pointer pcVar7;
  
  pcVar1 = (this->addresses).super__Vector_base<cbor_bytes,_std::allocator<cbor_bytes>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar2 = (this->addresses).super__Vector_base<cbor_bytes,_std::allocator<cbor_bytes>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pcVar7 = pcVar1;
  if (pcVar2 != pcVar1) {
    do {
      cbor_bytes::~cbor_bytes(pcVar7);
      pcVar7 = pcVar7 + 1;
    } while (pcVar7 != pcVar2);
    (this->addresses).super__Vector_base<cbor_bytes,_std::allocator<cbor_bytes>_>._M_impl.
    super__Vector_impl_data._M_finish = pcVar1;
  }
  pcVar3 = (this->class_ids).super__Vector_base<cdns_class_id,_std::allocator<cdns_class_id>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->class_ids).super__Vector_base<cdns_class_id,_std::allocator<cdns_class_id>_>._M_impl.
      super__Vector_impl_data._M_finish != pcVar3) {
    (this->class_ids).super__Vector_base<cdns_class_id,_std::allocator<cdns_class_id>_>._M_impl.
    super__Vector_impl_data._M_finish = pcVar3;
  }
  pcVar1 = (this->name_rdata).super__Vector_base<cbor_bytes,_std::allocator<cbor_bytes>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar2 = (this->name_rdata).super__Vector_base<cbor_bytes,_std::allocator<cbor_bytes>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pcVar7 = pcVar1;
  if (pcVar2 != pcVar1) {
    do {
      cbor_bytes::~cbor_bytes(pcVar7);
      pcVar7 = pcVar7 + 1;
    } while (pcVar7 != pcVar2);
    (this->name_rdata).super__Vector_base<cbor_bytes,_std::allocator<cbor_bytes>_>._M_impl.
    super__Vector_impl_data._M_finish = pcVar1;
  }
  pcVar4 = (this->q_sigs).
           super__Vector_base<cdns_query_signature,_std::allocator<cdns_query_signature>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->q_sigs).super__Vector_base<cdns_query_signature,_std::allocator<cdns_query_signature>_>
      ._M_impl.super__Vector_impl_data._M_finish != pcVar4) {
    (this->q_sigs).super__Vector_base<cdns_query_signature,_std::allocator<cdns_query_signature>_>.
    _M_impl.super__Vector_impl_data._M_finish = pcVar4;
  }
  std::vector<cdns_question_list,_std::allocator<cdns_question_list>_>::clear(&this->question_list);
  pcVar5 = (this->qrr).super__Vector_base<cdns_question,_std::allocator<cdns_question>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->qrr).super__Vector_base<cdns_question,_std::allocator<cdns_question>_>._M_impl.
      super__Vector_impl_data._M_finish != pcVar5) {
    (this->qrr).super__Vector_base<cdns_question,_std::allocator<cdns_question>_>._M_impl.
    super__Vector_impl_data._M_finish = pcVar5;
  }
  std::vector<cdns_rr_list,_std::allocator<cdns_rr_list>_>::clear(&this->rr_list);
  pcVar6 = (this->rrs).super__Vector_base<cdns_rr_field,_std::allocator<cdns_rr_field>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->rrs).super__Vector_base<cdns_rr_field,_std::allocator<cdns_rr_field>_>._M_impl.
      super__Vector_impl_data._M_finish != pcVar6) {
    (this->rrs).super__Vector_base<cdns_rr_field,_std::allocator<cdns_rr_field>_>._M_impl.
    super__Vector_impl_data._M_finish = pcVar6;
  }
  this->current_block = (cdnsBlock *)0x0;
  this->is_filled = false;
  return;
}

Assistant:

void cdnsBlockTables::clear()
{
    addresses.clear();
    class_ids.clear();
    name_rdata.clear();
    q_sigs.clear();
    question_list.clear();
    qrr.clear();
    rr_list.clear();
    rrs.clear();
    current_block = NULL;
    is_filled = false;
}